

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
::destroy_slots(raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                *this)

{
  bool bVar1;
  ctrl_t *pcVar2;
  size_t *psVar3;
  long *in_RDI;
  LayoutType<sizeof___(Ts),_signed_char,_char32_t> LVar4;
  Layout layout;
  size_t i;
  slot_type *in_stack_ffffffffffffffc8;
  allocator<char32_t> *in_stack_ffffffffffffffd0;
  allocator<char32_t> *alloc;
  
  if (in_RDI[3] != 0) {
    for (alloc = (allocator<char32_t> *)0x0; alloc != (allocator<char32_t> *)in_RDI[3];
        alloc = alloc + 1) {
      bVar1 = IsFull((ctrl_t)alloc[*in_RDI]);
      if (bVar1) {
        alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                   *)0x586fae);
        hash_policy_traits<phmap::priv::FlatHashSetPolicy<char32_t>,void>::
        destroy<std::allocator<char32_t>>(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
      }
    }
    LVar4.size_ = (size_t  [2])MakeLayout(0x586feb);
    SanitizerUnpoisonMemoryRegion((void *)in_RDI[1],in_RDI[3] << 2);
    alloc_ref((raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
               *)0x587018);
    internal_layout::
    LayoutImpl<std::tuple<signed_char,_char32_t>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
    ::AllocSize((LayoutImpl<std::tuple<signed_char,_char32_t>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>,_phmap::integer_sequence<unsigned_long,_0UL,_1UL>_>
                 *)*in_RDI);
    Deallocate<4ul,std::allocator<char32_t>>(alloc,LVar4.size_[1],LVar4.size_[0]);
    pcVar2 = EmptyGroup();
    *in_RDI = (long)pcVar2;
    in_RDI[1] = 0;
    in_RDI[2] = 0;
    in_RDI[3] = 0;
    psVar3 = growth_left((raw_hash_set<phmap::priv::FlatHashSetPolicy<char32_t>,_phmap::Hash<char32_t>,_phmap::EqualTo<char32_t>,_std::allocator<char32_t>_>
                          *)0x587071);
    *psVar3 = 0;
  }
  return;
}

Assistant:

void destroy_slots()
			{
				if (!capacity_) return;
				for (size_t i = 0; i != capacity_; ++i) {
					if (IsFull(ctrl_[i])) {
						PolicyTraits::destroy(&alloc_ref(), slots_ + i);
					}
				}
				auto layout = MakeLayout(capacity_);
				// Unpoison before returning the memory to the allocator.
				SanitizerUnpoisonMemoryRegion(slots_, sizeof(slot_type) * capacity_);
				Deallocate<Layout::Alignment()>(&alloc_ref(), ctrl_, layout.AllocSize());
				ctrl_ = EmptyGroup();
				slots_ = nullptr;
				size_ = 0;
				capacity_ = 0;
				growth_left() = 0;
			}